

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

void uv__fs_work(uv__work *w)

{
  uv_loop_s **buf;
  int iVar1;
  uv__work *ptr;
  iovec *piVar2;
  _func_void_uv__work_ptr_int *p_Var3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  __mode_t __mode;
  int iVar10;
  int iVar11;
  uv_dirent_type_t uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint *puVar17;
  void *pvVar18;
  long lVar19;
  ssize_t sVar20;
  size_t sVar21;
  size_t sVar22;
  dirent *dent;
  char *pcVar23;
  _func_void_uv__work_ptr *p_Var24;
  DIR *pDVar25;
  size_t sVar26;
  ssize_t sVar27;
  uv_loop_s *puVar28;
  _func_void_uv__work_ptr *p_Var29;
  long lVar30;
  _func_void_uv__work_ptr_int *p_Var31;
  ulong uVar32;
  _func_void_uv__work_ptr_int *p_Var33;
  _func_void_uv__work_ptr_int *p_Var34;
  iovec *iov;
  code *pcVar35;
  bool bVar36;
  ulong uVar37;
  size_t sVar38;
  uint minor;
  uint major;
  pollfd pfd;
  utsname u;
  int local_2184;
  int local_2180;
  int local_217c;
  _func_void_uv__work_ptr_int *local_2178;
  uv__work *local_2170;
  long local_2168;
  undefined1 *local_2160;
  stat local_2158;
  stat local_20c8;
  undefined1 local_2038 [16];
  void *local_2028;
  uint uStack_2020;
  uint uStack_201c;
  __gid_t _Stack_2018;
  int iStack_2014;
  uv_loop_s *puStack_2010;
  void *local_2008;
  __fsid_t _Stack_2000;
  uv_fs_type local_1ff8;
  char acStack_1ff4 [4];
  uv_loop_t *local_1ff0;
  uv_fs_cb p_Stack_1fe8;
  _func_void_uv__work_ptr_int *local_1fe0;
  uv_loop_s *puStack_1fd8;
  _func_void_uv__work_ptr *local_1fd0;
  _func_void_uv__work_ptr_int *p_Stack_1fc8;
  undefined1 local_1fb6 [142];
  char *local_1f28;
  uint local_1f20;
  uint local_1f1c;
  uv_buf_t *local_1f10;
  _func_void_uv__work_ptr_int *local_1f08;
  uv__work local_1ee8;
  size_t local_1eb8;
  undefined1 auVar5 [16];
  undefined1 auVar8 [16];
  
  iVar1 = *(int *)&w[-7].done;
  puVar17 = (uint *)__errno_location();
  local_2170 = w + 1;
  buf = &w[-6].loop;
LAB_00241dc9:
  *puVar17 = 0;
  switch(*(undefined4 *)&w[-7].done) {
  case 1:
    iVar11 = open((char *)w[-6].done,*(uint *)((long)w[-2].wq + 4) | 0x80000,
                  (ulong)*(uint *)(w[-2].wq + 1));
    break;
  case 2:
    iVar11 = uv__close_nocancel(*(int *)w[-2].wq);
    if (iVar11 == -1) {
      iVar11 = -(uint)(*puVar17 != 0x73 && *puVar17 != 4);
    }
    break;
  case 3:
    uVar14 = uv__getiovmax();
    uVar13 = *(uint *)((long)w[-2].wq + 0xc);
    if (uVar14 < uVar13) {
      *(uint *)((long)w[-2].wq + 0xc) = uVar14;
      uVar13 = uVar14;
    }
    p_Var34 = w[-1].done;
    if ((long)p_Var34 < 0) {
      piVar2 = (iovec *)w[-1].work;
      if (uVar13 == 1) {
        p_Var33 = (_func_void_uv__work_ptr_int *)
                  read(*(int *)w[-2].wq,piVar2->iov_base,piVar2->iov_len);
      }
      else {
        p_Var33 = (_func_void_uv__work_ptr_int *)readv(*(int *)w[-2].wq,piVar2,uVar13);
      }
    }
    else if (uVar13 == 1) {
      p_Var33 = (_func_void_uv__work_ptr_int *)
                pread(*(int *)w[-2].wq,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8),
                      (__off_t)p_Var34);
    }
    else {
      if (uv__fs_read_no_preadv != '\x01') {
        p_Var33 = (_func_void_uv__work_ptr_int *)
                  uv__preadv(*(int *)w[-2].wq,(iovec *)w[-1].work,uVar13,(int64_t)p_Var34);
        if ((p_Var33 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) ||
           (p_Var33 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, *puVar17 != 0x26))
        goto LAB_00242f2e;
        uv__fs_read_no_preadv = '\x01';
        uVar13 = *(uint *)((long)w[-2].wq + 0xc);
        p_Var34 = w[-1].done;
      }
      if (uVar13 == 0) {
        __assert_fail("nbufs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/fs.c"
                      ,0x1af,"ssize_t uv__fs_preadv(uv_file, uv_buf_t *, unsigned int, off_t)");
      }
      iVar11 = *(int *)w[-2].wq;
      p_Var24 = w[-1].work;
      p_Var29 = p_Var24 + (ulong)uVar13 * 0x10;
      p_Var33 = (_func_void_uv__work_ptr_int *)0x0;
      do {
        uVar37 = 0;
        do {
          while (sVar20 = pread(iVar11,(void *)(*(long *)p_Var24 + uVar37),
                                *(long *)(p_Var24 + 8) - uVar37,(__off_t)(p_Var34 + (long)p_Var33)),
                sVar20 == -1) {
            if ((long)(int)*puVar17 != 4) {
              if (p_Var33 == (_func_void_uv__work_ptr_int *)0x0) {
                p_Var33 = (_func_void_uv__work_ptr_int *)-(long)(int)*puVar17;
              }
              goto LAB_00242f2e;
            }
          }
          if (sVar20 == 0) goto LAB_00242f2e;
          uVar37 = uVar37 + sVar20;
          p_Var33 = p_Var33 + sVar20;
        } while (uVar37 < *(ulong *)(p_Var24 + 8));
        p_Var24 = p_Var24 + 0x10;
      } while (p_Var24 != p_Var29);
    }
LAB_00242f2e:
    if ((uv__work *)w[-1].work != local_2170) {
      uv__free((uv__work *)w[-1].work);
    }
    w[-1].work = (_func_void_uv__work_ptr *)0x0;
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    goto LAB_00242b41;
  case 4:
    uVar14 = uv__getiovmax();
    uVar13 = *(uint *)((long)w[-2].wq + 0xc);
    ptr = (uv__work *)w[-1].work;
    if (uVar13 != 0) {
      p_Var33 = (_func_void_uv__work_ptr_int *)0x0;
LAB_00242367:
      uVar15 = uVar14;
      if (uVar13 < uVar14) {
        uVar15 = uVar13;
      }
      *(uint *)((long)w[-2].wq + 0xc) = uVar15;
      do {
        p_Var34 = w[-1].done;
        if ((long)p_Var34 < 0) {
          piVar2 = (iovec *)w[-1].work;
          if (uVar15 == 1) {
            p_Var34 = (_func_void_uv__work_ptr_int *)
                      write(*(int *)w[-2].wq,piVar2->iov_base,piVar2->iov_len);
          }
          else {
            p_Var34 = (_func_void_uv__work_ptr_int *)writev(*(int *)w[-2].wq,piVar2,uVar15);
          }
LAB_002423d5:
          if (-1 < (long)p_Var34) goto LAB_00242416;
          uVar15 = *puVar17;
        }
        else {
          iov = (iovec *)w[-1].work;
          if ((uVar15 == 1) || (uv__fs_write_no_pwritev == '\x01')) {
LAB_0024238f:
            p_Var34 = (_func_void_uv__work_ptr_int *)
                      pwrite(*(int *)w[-2].wq,iov->iov_base,iov->iov_len,(__off_t)p_Var34);
            goto LAB_002423d5;
          }
          p_Var34 = (_func_void_uv__work_ptr_int *)
                    uv__pwritev(*(int *)w[-2].wq,iov,uVar15,(int64_t)p_Var34);
          if (p_Var34 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_002423d5;
          uVar15 = *puVar17;
          p_Var34 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
          if (uVar15 == 0x26) {
            uv__fs_write_no_pwritev = '\x01';
            iov = (iovec *)w[-1].work;
            p_Var34 = w[-1].done;
            goto LAB_0024238f;
          }
        }
        if (uVar15 != 4) goto LAB_002431a6;
        uVar15 = *(uint *)((long)w[-2].wq + 0xc);
      } while( true );
    }
    p_Var33 = (_func_void_uv__work_ptr_int *)0x0;
LAB_002431ad:
    if (ptr != local_2170) {
      uv__free(ptr);
    }
    w[-1].work = (_func_void_uv__work_ptr *)0x0;
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    goto LAB_00242b41;
  case 5:
    iVar11 = *(int *)w[-2].wq;
    iVar16 = *(int *)((long)w[-2].wq + 4);
    local_20c8.st_dev = (__dev_t)w[-1].done;
    p_Var33 = w[1].done;
    if (uv__fs_try_copy_file_range_no_copy_file_range_support == '\x01') goto LAB_00241f7b;
    sVar27 = uv__fs_copy_file_range
                       (iVar16,(off_t *)&local_20c8,iVar11,(off_t *)0x0,(size_t)p_Var33,0);
    if (sVar27 == -1) {
      uVar13 = *puVar17;
      if ((int)uVar13 < 0x12) {
        if (uVar13 == 1) {
          iVar10 = uv__is_cifs_or_smb(iVar11);
          if (iVar10 != 0) goto LAB_00241f7b;
LAB_00243142:
          uVar13 = *puVar17;
        }
        else if (uVar13 == 0xd) {
          iVar10 = fstatfs(iVar16,(statfs *)&local_2158);
          if ((iVar10 != -1) &&
             (CONCAT26(local_2158.st_dev._6_2_,
                       CONCAT24(local_2158.st_dev._4_2_,(int)local_2158.st_dev)) == 0xc36400)) {
            if (uv__kernel_version_cached_version == 0) {
              iVar10 = uname((utsname *)local_2038);
              if ((iVar10 == -1) ||
                 (iVar10 = __isoc99_sscanf(local_1fb6,"%u.%u.%u",&local_217c,&local_2180),
                 iVar10 != 3)) goto LAB_00241f7b;
              uv__kernel_version_cached_version =
                   local_2180 * 0x100 + local_217c * 0x10000 + local_2184;
            }
            if (uv__kernel_version_cached_version < 0x41400) goto LAB_00241f7b;
          }
          goto LAB_00243142;
        }
LAB_00243149:
        if (uVar13 == 0x26) goto LAB_00241f86;
      }
      else {
        if (uVar13 != 0x12) {
          if (uVar13 == 0x26) {
            uv__fs_try_copy_file_range_no_copy_file_range_support = '\x01';
            goto LAB_00241f86;
          }
          if (uVar13 != 0x5f) goto LAB_00243149;
        }
LAB_00241f7b:
        *puVar17 = 0x26;
LAB_00241f86:
        sVar20 = sendfile(iVar11,iVar16,(off_t *)&local_20c8,(size_t)p_Var33);
        if (sVar20 != -1) goto LAB_00242bac;
      }
      p_Var34 = w[-1].done;
      if ((long)local_20c8.st_dev <= (long)p_Var34) {
        uVar13 = *puVar17;
        if (((uVar13 < 0x17) && ((0x440020U >> (uVar13 & 0x1f) & 1) != 0)) ||
           (p_Var33 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, uVar13 == 0x58)) {
          *puVar17 = 0;
          if (w[1].done != (_func_void_uv__work_ptr_int *)0x0) {
            iVar11 = *(int *)w[-2].wq;
            iVar16 = *(int *)((long)w[-2].wq + 4);
            bVar36 = true;
            p_Var31 = (_func_void_uv__work_ptr_int *)0x0;
            local_2178 = w[1].done;
LAB_00242010:
            do {
              sVar26 = (long)local_2178 - (long)p_Var31;
              if (0x1fff < sVar26) {
                sVar26 = 0x2000;
              }
LAB_00242027:
              if (bVar36) {
                sVar21 = pread(iVar16,local_2038,sVar26,(__off_t)p_Var34);
              }
              else {
                sVar21 = read(iVar16,local_2038,sVar26);
              }
              if (sVar21 == 0xffffffffffffffff) goto code_r0x00242052;
              if (sVar21 == 0) goto LAB_00243110;
              if (0 < (long)sVar21) {
                lVar30 = 0;
                sVar26 = sVar21;
                do {
                  local_2160 = local_2038 + lVar30;
                  local_2168 = lVar30;
                  while (sVar20 = write(iVar11,local_2160,sVar26), sVar20 == -1) {
                    if (*puVar17 != 4) {
                      if (*puVar17 != 0xb) goto LAB_0024318b;
                      local_2158.st_dev._4_2_ = 4;
                      local_2158.st_dev._6_2_ = 0;
                      local_2158.st_dev._0_4_ = iVar11;
                      while (iVar10 = poll((pollfd *)&local_2158,1,-1), iVar10 == -1) {
                        if (*puVar17 != 4) goto LAB_00243180;
                      }
                      if ((local_2158.st_dev._6_2_ & 0xfffb) != 0) {
LAB_00243180:
                        *puVar17 = 5;
                        goto LAB_0024318b;
                      }
                    }
                  }
                  lVar30 = local_2168 + sVar20;
                  sVar26 = sVar21 - lVar30;
                } while (sVar26 != 0 && lVar30 <= (long)sVar21);
              }
              p_Var34 = p_Var34 + sVar21;
              p_Var31 = p_Var31 + sVar21;
              if (local_2178 <= p_Var31) {
LAB_00243110:
                if (p_Var31 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_0024311a;
                p_Var33 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
                goto LAB_00242b41;
              }
            } while( true );
          }
          p_Var31 = (_func_void_uv__work_ptr_int *)0x0;
LAB_0024311a:
          w[-1].done = p_Var34;
          p_Var33 = p_Var31;
        }
        goto LAB_00242b41;
      }
    }
LAB_00242bac:
    p_Var33 = (_func_void_uv__work_ptr_int *)(local_20c8.st_dev + -(long)w[-1].done);
    w[-1].done = (_func_void_uv__work_ptr_int *)local_20c8.st_dev;
    goto LAB_00242b41;
  case 6:
    p_Var33 = w[-6].done;
    iVar11 = uv__fs_statx(-1,(char *)p_Var33,0,0,(uv_stat_t *)buf);
    if (iVar11 == -0x26) {
      iVar11 = stat((char *)p_Var33,(stat *)local_2038);
LAB_002427c0:
      if (iVar11 == 0) {
        w[-6].loop = (uv_loop_s *)local_2038._0_8_;
        w[-6].wq[0] = (void *)(ulong)uStack_2020;
        w[-6].wq[1] = local_2028;
        uVar9 = 0;
        uVar7 = uStack_201c;
        auVar8._0_8_ = CONCAT44(uVar9,uVar7);
        auVar8._8_4_ = _Stack_2018;
        auVar8._12_4_ = 0;
        w[-5].work = (_func_void_uv__work_ptr *)auVar8._0_8_;
        w[-5].done = (_func_void_uv__work_ptr_int *)auVar8._8_8_;
        w[-5].loop = puStack_2010;
        w[-5].wq[0] = (void *)local_2038._8_8_;
        w[-5].wq[1] = local_2008;
        w[-4].work = (_func_void_uv__work_ptr *)_Stack_2000.__val;
        w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(acStack_1ff4,local_1ff8);
        w[-4].wq[1] = local_1ff0;
        w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
        w[-3].done = local_1fe0;
        w[-3].loop = puStack_1fd8;
        w[-2].work = local_1fd0;
        w[-2].done = p_Stack_1fc8;
        w[-3].wq[0] = local_1fd0;
        w[-3].wq[1] = p_Stack_1fc8;
        w[-4].loop = (uv_loop_s *)0x0;
        w[-4].wq[0] = (void *)0x0;
        iVar11 = 0;
      }
    }
    break;
  case 7:
    p_Var33 = w[-6].done;
    iVar11 = uv__fs_statx(-1,(char *)p_Var33,0,1,(uv_stat_t *)buf);
    if (iVar11 == -0x26) {
      iVar11 = lstat((char *)p_Var33,(stat *)local_2038);
      goto LAB_002427c0;
    }
    break;
  case 8:
    iVar16 = *(int *)w[-2].wq;
    iVar11 = uv__fs_statx(iVar16,"",1,0,(uv_stat_t *)buf);
    if ((iVar11 == -0x26) && (iVar11 = fstat(iVar16,(stat *)local_2038), iVar11 == 0)) {
      w[-6].loop = (uv_loop_s *)local_2038._0_8_;
      w[-6].wq[0] = (void *)(ulong)uStack_2020;
      w[-6].wq[1] = local_2028;
      uVar6 = 0;
      uVar4 = uStack_201c;
      auVar5._0_8_ = CONCAT44(uVar6,uVar4);
      auVar5._8_4_ = _Stack_2018;
      auVar5._12_4_ = 0;
      w[-5].work = (_func_void_uv__work_ptr *)auVar5._0_8_;
      w[-5].done = (_func_void_uv__work_ptr_int *)auVar5._8_8_;
      w[-5].loop = puStack_2010;
      w[-5].wq[0] = (void *)local_2038._8_8_;
      w[-5].wq[1] = local_2008;
      w[-4].work = (_func_void_uv__work_ptr *)_Stack_2000.__val;
      w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(acStack_1ff4,local_1ff8);
      w[-4].wq[1] = local_1ff0;
      w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
      w[-3].done = local_1fe0;
      w[-3].loop = puStack_1fd8;
      w[-2].work = local_1fd0;
      w[-2].done = p_Stack_1fc8;
      w[-3].wq[0] = local_1fd0;
      w[-3].wq[1] = p_Stack_1fc8;
      w[-4].loop = (uv_loop_s *)0x0;
      w[-4].wq[0] = (void *)0x0;
      iVar11 = 0;
    }
    break;
  case 9:
    iVar11 = ftruncate(*(int *)w[-2].wq,(__off_t)w[-1].done);
    break;
  case 10:
    lVar30 = (long)(double)w[-1].wq[0];
    pvVar18 = (void *)(((long)(((double)w[-1].wq[0] - (double)lVar30) * 1000000000.0) / 1000) * 1000
                      );
    local_2038._0_8_ = ((long)pvVar18 >> 0x3f) + lVar30;
    local_2038._8_8_ = (void *)(long)((double)(long)pvVar18 + 1000000000.0);
    if (-1 < (long)pvVar18) {
      local_2038._8_8_ = pvVar18;
    }
    lVar30 = (long)(double)w[-1].wq[1];
    lVar19 = ((long)(((double)w[-1].wq[1] - (double)lVar30) * 1000000000.0) / 1000) * 1000;
    local_2028 = (void *)((lVar19 >> 0x3f) + lVar30);
    lVar30 = (long)((double)lVar19 + 1000000000.0);
    if (-1 < lVar19) {
      lVar30 = lVar19;
    }
    uStack_2020 = (uint)lVar30;
    uStack_201c = (uint)((ulong)lVar30 >> 0x20);
    p_Var33 = w[-6].done;
    iVar11 = 0;
    goto LAB_0024226d;
  case 0xb:
    lVar30 = (long)(double)w[-1].wq[0];
    pvVar18 = (void *)(((long)(((double)w[-1].wq[0] - (double)lVar30) * 1000000000.0) / 1000) * 1000
                      );
    local_2038._0_8_ = ((long)pvVar18 >> 0x3f) + lVar30;
    local_2038._8_8_ = (void *)(long)((double)(long)pvVar18 + 1000000000.0);
    if (-1 < (long)pvVar18) {
      local_2038._8_8_ = pvVar18;
    }
    lVar30 = (long)(double)w[-1].wq[1];
    lVar19 = ((long)(((double)w[-1].wq[1] - (double)lVar30) * 1000000000.0) / 1000) * 1000;
    local_2028 = (void *)((lVar19 >> 0x3f) + lVar30);
    lVar30 = (long)((double)lVar19 + 1000000000.0);
    if (-1 < lVar19) {
      lVar30 = lVar19;
    }
    uStack_2020 = (uint)lVar30;
    uStack_201c = (uint)((ulong)lVar30 >> 0x20);
    iVar11 = futimens(*(int *)w[-2].wq,(timespec *)local_2038);
    break;
  case 0xc:
    iVar11 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
    break;
  case 0xd:
    iVar11 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0xe:
    iVar11 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0xf:
    iVar11 = fsync(*(int *)w[-2].wq);
    break;
  case 0x10:
    iVar11 = fdatasync(*(int *)w[-2].wq);
    break;
  case 0x11:
    iVar11 = unlink((char *)w[-6].done);
    break;
  case 0x12:
    iVar11 = rmdir((char *)w[-6].done);
    break;
  case 0x13:
    iVar11 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0x14:
    pcVar23 = mkdtemp((char *)w[-6].done);
    p_Var33 = (_func_void_uv__work_ptr_int *)-(ulong)(pcVar23 == (char *)0x0);
    goto LAB_00242b41;
  case 0x15:
    iVar11 = rename((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x16:
    local_2038._0_8_ = (uv_loop_s *)0x0;
    iVar11 = scandir((char *)w[-6].done,(dirent ***)local_2038,uv__fs_scandir_filter,
                     uv__fs_scandir_sort);
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    if (iVar11 != -1) {
      puVar28 = (uv_loop_s *)local_2038._0_8_;
      if (iVar11 == 0) {
        free((void *)local_2038._0_8_);
        puVar28 = (uv_loop_s *)0x0;
      }
      w[-6].work = (_func_void_uv__work_ptr *)puVar28;
      goto LAB_00242c23;
    }
LAB_00242ee3:
    p_Var33 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    goto LAB_00242b41;
  case 0x17:
    iVar11 = link((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x18:
    iVar11 = symlink((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x19:
    sVar22 = pathconf((char *)w[-6].done,4);
    sVar38 = 0x1000;
    if (sVar22 != 0xffffffffffffffff) {
      sVar38 = sVar22;
    }
    p_Var24 = (_func_void_uv__work_ptr *)uv__malloc(sVar38);
    if (p_Var24 == (_func_void_uv__work_ptr *)0x0) {
      *puVar17 = 0xc;
    }
    else {
      sVar22 = readlink((char *)w[-6].done,(char *)p_Var24,sVar38);
      if (sVar22 == 0xffffffffffffffff) {
        uv__free(p_Var24);
      }
      else if ((sVar22 != sVar38) ||
              (p_Var24 = (_func_void_uv__work_ptr *)uv__reallocf(p_Var24,sVar38 + 1),
              sVar22 = sVar38, p_Var24 != (_func_void_uv__work_ptr *)0x0)) {
        p_Var24[sVar22] = (_func_void_uv__work_ptr)0x0;
        goto LAB_00243302;
      }
    }
    goto LAB_00242b4b;
  case 0x1a:
    iVar11 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1b:
    iVar11 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1c:
    p_Var24 = (_func_void_uv__work_ptr *)realpath((char *)w[-6].done,(char *)0x0);
    if (p_Var24 != (_func_void_uv__work_ptr *)0x0) goto LAB_00243302;
    goto LAB_00242b4b;
  case 0x1d:
    uVar13 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-6].done,0,0,(uv_fs_cb)0x0)
    ;
    uv_fs_req_cleanup((uv_fs_t *)local_2038);
    if (-1 < (int)uVar13) {
      iVar11 = fstat(uVar13,&local_2158);
      __mode = local_2158.st_mode;
      if (iVar11 == 0) {
        uVar15 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,
                            (*(uint *)((long)w[-2].wq + 4) & 1) << 7 | 0x41,local_2158.st_mode,
                            (uv_fs_cb)0x0);
        uv_fs_req_cleanup((uv_fs_t *)local_2038);
        uVar14 = uVar15;
        if (-1 < (int)uVar15) {
          if (((ulong)w[-2].wq[0] & 0x100000000) == 0) {
            iVar11 = fstat(uVar15,&local_20c8);
            if (iVar11 == 0) {
              if (((_func_void_uv__work_ptr_int *)
                   CONCAT26(local_2158.st_dev._6_2_,
                            CONCAT24(local_2158.st_dev._4_2_,(int)local_2158.st_dev)) ==
                   (_func_void_uv__work_ptr_int *)local_20c8.st_dev) &&
                 (local_2158.st_ino == local_20c8.st_ino)) goto LAB_0024319c;
              iVar11 = ftruncate(uVar15,0);
              if (iVar11 == 0) goto LAB_00242dc2;
            }
LAB_002430f5:
            p_Var33 = (_func_void_uv__work_ptr_int *)(ulong)-*puVar17;
            goto LAB_00242a64;
          }
LAB_00242dc2:
          iVar11 = fchmod(uVar15,__mode);
          if (iVar11 == -1) {
            if (*puVar17 != 1) {
              p_Var33 = (_func_void_uv__work_ptr_int *)(ulong)-*puVar17;
              goto LAB_00242a64;
            }
            iVar11 = uv__is_cifs_or_smb(uVar15);
            if (iVar11 == 0) {
              uVar14 = 0xffffffff;
              goto LAB_00242a6e;
            }
          }
          if (((ulong)w[-2].wq[0] & 0x600000000) != 0) {
            iVar11 = ioctl(uVar15,0x40049409,(ulong)uVar13);
            uVar14 = 0;
            if (iVar11 == 0) goto LAB_00242a6e;
            if (((ulong)w[-2].wq[0] & 0x400000000) != 0) goto LAB_002430f5;
          }
          if (local_2158.st_size == 0) {
LAB_0024319c:
            uVar14 = 0;
          }
          else {
            p_Var34 = (_func_void_uv__work_ptr_int *)0x0;
            sVar38 = local_2158.st_size;
            do {
              local_2038._8_4_ = 6;
              local_1ff8 = UV_FS_SENDFILE;
              uVar14 = 0;
              local_1f28 = (char *)0x0;
              local_1f10 = (uv_buf_t *)0x0;
              local_1fd0 = (_func_void_uv__work_ptr *)0x0;
              local_1fe0 = (_func_void_uv__work_ptr_int *)0x0;
              puStack_1fd8 = (uv_loop_s *)0x0;
              local_1ff0 = (uv_loop_t *)0x0;
              p_Stack_1fe8 = (uv_fs_cb)0x0;
              local_1f20 = uVar15;
              local_1f1c = uVar13;
              local_1f08 = p_Var34;
              local_1eb8 = sVar38;
              uv__fs_work(&local_1ee8);
              p_Var33 = local_1fe0;
              uv_fs_req_cleanup((uv_fs_t *)local_2038);
              if ((long)p_Var33 < 0) goto LAB_00242a64;
              p_Var34 = p_Var34 + (long)p_Var33;
              sVar38 = sVar38 - (long)p_Var33;
            } while (sVar38 != 0);
          }
        }
      }
      else {
        p_Var33 = (_func_void_uv__work_ptr_int *)(ulong)-*puVar17;
        uVar15 = 0xffffffff;
LAB_00242a64:
        uVar14 = (int)(uint)p_Var33 >> 0x1f & (uint)p_Var33;
      }
LAB_00242a6e:
      uVar13 = uv__close_nocheckstdio(uVar13);
      if (uVar13 == 0) {
        uVar13 = uVar14;
      }
      if (uVar14 != 0) {
        uVar13 = uVar14;
      }
      if ((int)uVar15 < 0) {
        if (uVar13 == 0) goto LAB_00242eef;
      }
      else {
        uVar14 = uv__close_nocheckstdio(uVar15);
        if (uVar14 == 0) {
          uVar14 = uVar13;
        }
        if (uVar13 == 0) {
          uVar13 = uVar14;
        }
        if (uVar13 == 0) {
          p_Var33 = (_func_void_uv__work_ptr_int *)0x0;
          goto LAB_00242b41;
        }
        uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,(uv_fs_cb)0x0);
        uv_fs_req_cleanup((uv_fs_t *)local_2038);
      }
      *puVar17 = -uVar13;
      goto LAB_00242ee3;
    }
    p_Var33 = (_func_void_uv__work_ptr_int *)(long)(int)uVar13;
    goto LAB_00242b41;
  case 0x1e:
    iVar11 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1f:
    p_Var24 = (_func_void_uv__work_ptr *)uv__malloc(0x38);
    if (p_Var24 == (_func_void_uv__work_ptr *)0x0) {
LAB_00242b6a:
      uv__free(p_Var24);
      p_Var33 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      p_Var24 = (_func_void_uv__work_ptr *)0x0;
    }
    else {
      pDVar25 = opendir((char *)w[-6].done);
      *(DIR **)(p_Var24 + 0x30) = pDVar25;
      if (pDVar25 == (DIR *)0x0) goto LAB_00242b6a;
      p_Var33 = (_func_void_uv__work_ptr_int *)0x0;
    }
    w[-6].work = p_Var24;
    goto LAB_00242b41;
  case 0x20:
    p_Var24 = w[-6].work;
    if (*(long *)(p_Var24 + 8) != 0) {
      uVar32 = 0;
      uVar37 = 0;
LAB_002425bd:
      do {
        *puVar17 = 0;
        dent = readdir(*(DIR **)(p_Var24 + 0x30));
        if (dent == (dirent *)0x0) {
          if (*puVar17 != 0) {
LAB_00242cdb:
            if ((int)uVar37 != 0) {
              lVar30 = *(long *)p_Var24;
              lVar19 = 0;
              do {
                uv__free(*(void **)(lVar30 + lVar19));
                lVar30 = *(long *)p_Var24;
                *(undefined8 *)(lVar30 + lVar19) = 0;
                lVar19 = lVar19 + 0x10;
              } while (uVar37 << 4 != lVar19);
            }
            uVar37 = 0xffffffff;
          }
          break;
        }
        if ((dent->d_name[0] == '.') &&
           ((dent->d_name[1] == '\0' || ((dent->d_name[1] == '.' && (dent->d_name[2] == '\0'))))))
        goto LAB_002425f9;
        lVar30 = *(long *)p_Var24;
        pcVar23 = uv__strdup(dent->d_name);
        *(char **)(lVar30 + uVar32 * 0x10) = pcVar23;
        if (pcVar23 == (char *)0x0) goto LAB_00242cdb;
        uVar12 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
        *(uv_dirent_type_t *)(lVar30 + uVar32 * 0x10 + 8) = uVar12;
        uVar32 = (ulong)((int)uVar37 + 1);
        uVar37 = uVar32;
      } while (uVar32 < *(ulong *)(p_Var24 + 8));
      goto LAB_00242d17;
    }
    uVar37 = 0;
LAB_00242d17:
    p_Var33 = (_func_void_uv__work_ptr_int *)(long)(int)uVar37;
    goto LAB_00242b41;
  case 0x21:
    p_Var24 = w[-6].work;
    if (*(DIR **)(p_Var24 + 0x30) != (DIR *)0x0) {
      closedir(*(DIR **)(p_Var24 + 0x30));
      *(undefined8 *)(p_Var24 + 0x30) = 0;
      p_Var24 = w[-6].work;
    }
    uv__free(p_Var24);
    p_Var24 = (_func_void_uv__work_ptr *)0x0;
LAB_00243302:
    w[-6].work = p_Var24;
    w[-7].wq[1] = (void *)0x0;
    goto LAB_00243298;
  case 0x22:
    iVar11 = statfs((char *)w[-6].done,(statfs *)local_2038);
    p_Var33 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    if (iVar11 == 0) {
      p_Var24 = (_func_void_uv__work_ptr *)uv__malloc(0x58);
      if (p_Var24 == (_func_void_uv__work_ptr *)0x0) {
        *puVar17 = 0xc;
      }
      else {
        *(undefined8 *)p_Var24 = local_2038._0_8_;
        *(undefined8 *)(p_Var24 + 8) = local_2038._8_8_;
        *(void **)(p_Var24 + 0x10) = local_2028;
        *(long *)(p_Var24 + 0x18) = CONCAT44(uStack_201c,uStack_2020);
        *(long *)(p_Var24 + 0x20) = CONCAT44(iStack_2014,_Stack_2018);
        *(uv_loop_s **)(p_Var24 + 0x28) = puStack_2010;
        *(void **)(p_Var24 + 0x30) = local_2008;
        w[-6].work = p_Var24;
LAB_00242eef:
        p_Var33 = (_func_void_uv__work_ptr_int *)0x0;
      }
    }
    goto LAB_00242b41;
  case 0x23:
    p_Var33 = w[-6].done;
    sVar26 = strlen((char *)p_Var33);
    if ((sVar26 < 6) || (iVar11 = strcmp((char *)(p_Var33 + (sVar26 - 6)),"XXXXXX"), iVar11 != 0)) {
      *puVar17 = 0x16;
      iVar11 = -1;
    }
    else {
      uv_once(&uv__fs_mkstemp_once,uv__mkostemp_initonce);
      if (uv__mkostemp != (_func_int_char_ptr_int *)0x0 &&
          (uv__fs_mkstemp_no_cloexec_support & 1) == 0) {
        iVar11 = (*uv__mkostemp)((char *)p_Var33,0x80000);
        if (-1 < iVar11) goto LAB_00242c23;
        if (*puVar17 != 0x16) goto LAB_00242b26;
        uv__fs_mkstemp_no_cloexec_support = 1;
      }
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
      }
      iVar11 = mkstemp((char *)p_Var33);
      if ((-1 < iVar11) && (iVar16 = uv__cloexec(iVar11,1), iVar16 != 0)) {
        iVar16 = uv__close(iVar11);
        iVar11 = -1;
        if (iVar16 != 0) {
switchD_00241df3_default:
          abort();
        }
      }
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
      }
      if (-1 < iVar11) goto LAB_00242c23;
    }
LAB_00242b26:
    *p_Var33 = (_func_void_uv__work_ptr_int)0x0;
LAB_00242c23:
    p_Var33 = (_func_void_uv__work_ptr_int *)(long)iVar11;
    goto LAB_00242b41;
  case 0x24:
    lVar30 = (long)(double)w[-1].wq[0];
    pvVar18 = (void *)(((long)(((double)w[-1].wq[0] - (double)lVar30) * 1000000000.0) / 1000) * 1000
                      );
    local_2038._0_8_ = ((long)pvVar18 >> 0x3f) + lVar30;
    local_2038._8_8_ = (void *)(long)((double)(long)pvVar18 + 1000000000.0);
    if (-1 < (long)pvVar18) {
      local_2038._8_8_ = pvVar18;
    }
    lVar30 = (long)(double)w[-1].wq[1];
    lVar19 = ((long)(((double)w[-1].wq[1] - (double)lVar30) * 1000000000.0) / 1000) * 1000;
    local_2028 = (void *)((lVar19 >> 0x3f) + lVar30);
    lVar30 = (long)((double)lVar19 + 1000000000.0);
    if (-1 < lVar19) {
      lVar30 = lVar19;
    }
    uStack_2020 = (uint)lVar30;
    uStack_201c = (uint)((ulong)lVar30 >> 0x20);
    p_Var33 = w[-6].done;
    iVar11 = 0x100;
LAB_0024226d:
    iVar11 = utimensat(-100,(char *)p_Var33,(timespec *)local_2038,iVar11);
    break;
  default:
    goto switchD_00241df3_default;
  }
  p_Var33 = (_func_void_uv__work_ptr_int *)(long)iVar11;
  goto LAB_00242b41;
LAB_002425f9:
  if (*(ulong *)(p_Var24 + 8) <= uVar32) goto LAB_00242d17;
  goto LAB_002425bd;
code_r0x00242052:
  uVar13 = *puVar17;
  if (uVar13 != 4) goto code_r0x0024205e;
  goto LAB_00242027;
code_r0x0024205e:
  if ((!bVar36) || (p_Var31 != (_func_void_uv__work_ptr_int *)0x0)) {
    p_Var33 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    if (p_Var31 + 1 < (code *)0x2) goto LAB_00242b41;
    goto LAB_0024311a;
  }
  bVar36 = false;
  p_Var31 = (_func_void_uv__work_ptr_int *)0x0;
  if ((uVar13 == 5) || (p_Var31 = (_func_void_uv__work_ptr_int *)0x0, uVar13 == 0x1d))
  goto LAB_00242010;
LAB_0024318b:
  p_Var33 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
LAB_00242b41:
  if (p_Var33 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
    w[-7].wq[1] = p_Var33;
    if (p_Var33 != (_func_void_uv__work_ptr_int *)0x0) {
      return;
    }
LAB_00243298:
    if (2 < *(int *)&w[-7].done - 6U) {
      return;
    }
    w[-6].work = (_func_void_uv__work_ptr *)buf;
    return;
  }
LAB_00242b4b:
  if ((0xfffffffd < iVar1 - 4U) || (*puVar17 != 4)) {
    w[-7].wq[1] = (void *)-(long)(int)*puVar17;
    return;
  }
  goto LAB_00241dc9;
LAB_00242416:
  if (p_Var34 == (_func_void_uv__work_ptr_int *)0x0) {
    p_Var34 = (_func_void_uv__work_ptr_int *)0x0;
LAB_002431a6:
    if (p_Var33 == (_func_void_uv__work_ptr_int *)0x0) {
      p_Var33 = p_Var34;
    }
    goto LAB_002431ad;
  }
  if (-1 < (long)w[-1].done) {
    w[-1].done = w[-1].done + (long)p_Var34;
  }
  p_Var24 = w[-1].work;
  pcVar35 = p_Var24 + 8;
  uVar15 = 0;
  p_Var31 = p_Var34;
  do {
    p_Var3 = *(_func_void_uv__work_ptr_int **)pcVar35;
    if (p_Var31 <= p_Var3 && (long)p_Var3 - (long)p_Var31 != 0) {
      *(_func_void_uv__work_ptr_int **)(pcVar35 + -8) = p_Var31 + *(ulong *)(pcVar35 + -8);
      *(long *)pcVar35 = (long)p_Var3 - (long)p_Var31;
      break;
    }
    uVar15 = uVar15 + 1;
    pcVar35 = pcVar35 + 0x10;
    p_Var31 = p_Var31 + -(long)p_Var3;
  } while (p_Var31 != (_func_void_uv__work_ptr_int *)0x0);
  *(uint *)((long)w[-2].wq + 0xc) = uVar15;
  w[-1].work = p_Var24 + (ulong)uVar15 * 0x10;
  p_Var33 = p_Var33 + (long)p_Var34;
  uVar13 = uVar13 - uVar15;
  if (uVar13 == 0) goto LAB_002431ad;
  goto LAB_00242367;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, uv__fs_close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LUTIME, uv__fs_lutime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(MKSTEMP, uv__fs_mkstemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(OPENDIR, uv__fs_opendir(req));
    X(READDIR, uv__fs_readdir(req));
    X(CLOSEDIR, uv__fs_closedir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(STATFS, uv__fs_statfs(req));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}